

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::MethodOptions::MethodOptions(MethodOptions *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MethodOptions_006220e0;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_MethodOptions_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_MethodOptions_google_2fprotobuf_2fdescriptor_2eproto.base);
  }
  this->deprecated_ = false;
  *(undefined3 *)&this->field_0x49 = 0;
  this->idempotency_level_ = 0;
  return;
}

Assistant:

MethodOptions::MethodOptions()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.MethodOptions)
}